

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

bool cfd::core::ScriptOperator::IsValid(string *message)

{
  bool bVar1;
  __type _Var2;
  int __val;
  iterator iVar3;
  bool bVar4;
  string sStack_68;
  string opcode_text;
  
  bVar4 = false;
  if ((message->_M_string_length != 0) &&
     (bVar4 = false, g_operator_text_map_abi_cxx11_._40_8_ != 0)) {
    bVar1 = ::std::operator==(message,"OP_0");
    bVar4 = true;
    if ((!bVar1) && (bVar1 = ::std::operator==(message,"OP_1NEGATE"), !bVar1)) {
      if (3 < message->_M_string_length) {
        ::std::__cxx11::string::substr((ulong)&opcode_text,(ulong)message);
        __val = atoi(opcode_text._M_dataplus._M_p);
        ::std::__cxx11::string::~string((string *)&opcode_text);
        ::std::__cxx11::to_string(&sStack_68,__val);
        ::std::operator+(&opcode_text,"OP_",&sStack_68);
        ::std::__cxx11::string::~string((string *)&sStack_68);
        _Var2 = ::std::operator==(message,&opcode_text);
        ::std::__cxx11::string::~string((string *)&opcode_text);
        if (_Var2 && __val - 1U < 0x10) {
          return true;
        }
      }
      iVar3 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
                      *)g_operator_text_map_abi_cxx11_,message);
      bVar4 = iVar3._M_node != (_Base_ptr)(g_operator_text_map_abi_cxx11_ + 8);
    }
  }
  return bVar4;
}

Assistant:

bool ScriptOperator::IsValid(const std::string& message) {
  if (message.empty()) return false;
  if (g_operator_text_map.empty()) return false;
  if ((message == "OP_0") || (message == "OP_1NEGATE")) {
    return true;
  } else if (message.length() >= 4) {
    int num = std::atoi(message.substr(3).c_str());
    std::string opcode_text = "OP_" + std::to_string(num);
    if ((message == opcode_text) && (num >= 1) && (num <= 16)) {
      return true;
    }
  }
  return (g_operator_text_map.find(message) != g_operator_text_map.end());
}